

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedReadWriteCase1::Run(AdvancedReadWriteCase1 *this)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  Vector<float,_3> local_d0;
  Vector<float,_3> local_c4;
  undefined8 local_b8;
  float data [8];
  float *ptr;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedReadWriteCase1 *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    glsl_fs = 
    "\nlayout(location = 0) in vec4 g_in_position;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  if (gl_VertexID == 0) {\n    g_buffer.out_color = g_buffer.in_color;\n    memoryBarrier();\n  }\n  gl_Position = g_in_position;\n}"
    ;
    local_28 = 
    "\nlayout(location = 0) out vec4 g_fs_out;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  g_fs_out = g_buffer.out_color;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 0) in vec4 g_in_position;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  if (gl_VertexID == 0) {\n    g_buffer.out_color = g_buffer.in_color;\n    memoryBarrier();\n  }\n  gl_Position = g_in_position;\n}"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nlayout(location = 0) out vec4 g_fs_out;\ncoherent buffer Buffer {\n  vec4 in_color;\n  vec4 out_color;\n} g_buffer;\nvoid main() {\n  g_fs_out = g_buffer.out_color;\n}"
               ,(allocator<char> *)((long)&ptr + 7));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_48,&local_80);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ptr + 7));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x20,(void *)0x0,0x88e8);
      puVar5 = (undefined4 *)
               glu::CallLogWrapper::glMapBuffer
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0x88b9);
      if (puVar5 == (undefined4 *)0x0) {
        this_local = (AdvancedReadWriteCase1 *)&DAT_ffffffffffffffff;
      }
      else {
        *puVar5 = 0;
        puVar5[1] = 0x3f800000;
        puVar5[2] = 0;
        puVar5[3] = 0x3f800000;
        puVar5[4] = 0;
        puVar5[5] = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        local_b8 = 0xbf800000bf800000;
        data[0] = 1.0;
        data[1] = -1.0;
        data[2] = -1.0;
        data[3] = 1.0;
        data[4] = 1.0;
        data[5] = 1.0;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0x20,&local_b8,0x88e4);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glClear
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_vertex_array);
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,0,4);
        iVar3 = ShaderStorageBufferObjectBase::getWindowWidth
                          (&this->super_ShaderStorageBufferObjectBase);
        iVar4 = ShaderStorageBufferObjectBase::getWindowHeight
                          (&this->super_ShaderStorageBufferObjectBase);
        tcu::Vector<float,_3>::Vector(&local_c4,0.0,1.0,0.0);
        bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,0,0,iVar3,iVar4,&local_c4);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          puVar5 = (undefined4 *)
                   glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,2);
          if (puVar5 == (undefined4 *)0x0) {
            this_local = (AdvancedReadWriteCase1 *)&DAT_ffffffffffffffff;
          }
          else {
            *puVar5 = 0x3f800000;
            puVar5[1] = 0;
            puVar5[2] = 0x3f800000;
            puVar5[3] = 0x3f800000;
            glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,0x90d2);
            glu::CallLogWrapper::glDrawArrays
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,5,0,4);
            iVar3 = ShaderStorageBufferObjectBase::getWindowWidth
                              (&this->super_ShaderStorageBufferObjectBase);
            iVar4 = ShaderStorageBufferObjectBase::getWindowHeight
                              (&this->super_ShaderStorageBufferObjectBase);
            tcu::Vector<float,_3>::Vector(&local_d0,1.0,0.0,1.0);
            bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                              (&this->super_ShaderStorageBufferObjectBase,0,0,iVar3,iVar4,&local_d0)
            ;
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              this_local = (AdvancedReadWriteCase1 *)0x0;
            }
            else {
              this_local = (AdvancedReadWriteCase1 *)&DAT_ffffffffffffffff;
            }
          }
        }
        else {
          this_local = (AdvancedReadWriteCase1 *)&DAT_ffffffffffffffff;
        }
      }
    }
    else {
      this_local = (AdvancedReadWriteCase1 *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedReadWriteCase1 *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "coherent buffer Buffer {" NL
									   "  vec4 in_color;" NL "  vec4 out_color;" NL "} g_buffer;" NL "void main() {" NL
									   "  if (gl_VertexID == 0) {" NL "    g_buffer.out_color = g_buffer.in_color;" NL
									   "    memoryBarrier();" NL "  }" NL "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "coherent buffer Buffer {" NL "  vec4 in_color;" NL
			   "  vec4 out_color;" NL "} g_buffer;" NL "void main() {" NL "  g_fs_out = g_buffer.out_color;" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 2 * sizeof(float) * 4, NULL, GL_DYNAMIC_DRAW);
		float* ptr = reinterpret_cast<float*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_WRITE_ONLY));
		if (!ptr)
			return ERROR;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		*ptr++ = 0.0f;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, -1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		// update input color
		ptr = reinterpret_cast<float*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(float) * 4, GL_MAP_WRITE_BIT));
		if (!ptr)
			return ERROR;
		*ptr++ = 1.0f;
		*ptr++ = 0.0f;
		*ptr++ = 1.0f;
		*ptr++ = 1.0f;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(1.0f, 0.0f, 1.0f)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}